

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

void __thiscall
sglr::rc::ObjectManager<sglr::rc::Framebuffer>::releaseReference
          (ObjectManager<sglr::rc::Framebuffer> *this,Framebuffer *object)

{
  int *piVar1;
  deUint32 local_c;
  
  piVar1 = &(object->super_NamedObject).m_refCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  local_c = (object->super_NamedObject).m_name;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>_>_>
  ::erase(&(this->m_objects)._M_t,&local_c);
  (*(object->super_NamedObject)._vptr_NamedObject[1])(object);
  return;
}

Assistant:

void			decRefCount			(void)			{ DE_ASSERT(m_refCount > 0); m_refCount -= 1;	}